

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

sunrealtype N_VMaxNormLocal_ManyVector(N_Vector x)

{
  sunindextype i;
  long lVar1;
  sunrealtype sVar2;
  double dVar3;
  
  sVar2 = 0.0;
  for (lVar1 = 0; lVar1 < *x->content; lVar1 = lVar1 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)((long)x->content + 0x10) + lVar1 * 8) + 8) + 0x148)
        == 0) {
      dVar3 = (double)N_VMaxNorm();
    }
    else {
      dVar3 = (double)N_VMaxNormLocal();
    }
    if (sVar2 <= dVar3) {
      sVar2 = dVar3;
    }
  }
  return sVar2;
}

Assistant:

sunrealtype MVAPPEND(N_VMaxNormLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype max, lmax;

  /* initialize output*/
  max = ZERO;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvmaxnormlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvmaxnormlocal)
    {
      lmax = N_VMaxNormLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      max = (max > lmax) ? max : lmax;

      /* otherwise, call nvmaxnorm and accumulate to overall max */
    }
    else
    {
      lmax = N_VMaxNorm(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      max = (max > lmax) ? max : lmax;
    }
  }

  return (max);
}